

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

ident * newident(char *name,int flags)

{
  char cVar1;
  char *__src;
  ident *piVar2;
  long lVar3;
  size_t sVar4;
  char *__dest;
  ident **ppiVar5;
  char *local_78;
  ident local_70;
  ident *local_30;
  
  local_78 = name;
  piVar2 = hashset<ident>::access<char_const*>(&idents,&local_78);
  __src = local_78;
  if (piVar2 != (ident *)0x0) {
    return piVar2;
  }
  cVar1 = *local_78;
  if ((int)cVar1 - 0x30U < 10) {
LAB_00126b46:
    debugcode("number %s is not a valid identifier name",local_78);
    piVar2 = dummyident;
  }
  else {
    if (cVar1 == '+') {
LAB_00126b7e:
      if ((int)local_78[1] - 0x30U < 10) goto LAB_00126b46;
      lVar3 = 2;
      if (local_78[1] == '.') goto LAB_00126b9c;
    }
    else if (cVar1 == '.') {
      lVar3 = 1;
LAB_00126b9c:
      if ((int)local_78[lVar3] - 0x30U < 10) goto LAB_00126b46;
    }
    else if (cVar1 == '-') goto LAB_00126b7e;
    sVar4 = strlen(local_78);
    __dest = (char *)operator_new__(sVar4 + 1);
    strncpy(__dest,__src,sVar4 + 1);
    __dest[sVar4] = '\0';
    local_70.type = 4;
    local_70.field_2.minval = 0;
    local_70.field_3.code = (uint *)0x0;
    local_70.field_5.stack = (identstack *)0x0;
    local_70.name = __dest;
    local_70.flags = flags;
    if (initedidents == '\0') {
      if (identinits == (vector<ident> *)0x0) {
        identinits = (vector<ident> *)operator_new(0x10);
        identinits->buf = (ident *)0x0;
        identinits->alen = 0;
        identinits->ulen = 0;
      }
      vector<ident>::add(identinits,&local_70);
      piVar2 = (ident *)0x0;
    }
    else {
      local_30 = hashset<ident>::access<char_const*,ident>(&idents,&local_70.name,&local_70);
      local_30->index = identmap.ulen;
      ppiVar5 = vector<ident_*>::add(&identmap,&local_30);
      piVar2 = *ppiVar5;
    }
  }
  return piVar2;
}

Assistant:

ident *newident(const char *name, int flags)
{
    ident *id = idents.access(name);
    if(!id)
    {
        if(checknumber(name))
        {
            debugcode("number %s is not a valid identifier name", name);
            return dummyident;
        }
        id = addident(ident(ID_ALIAS, newstring(name), flags));
    }
    return id;
}